

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

ssize_t __thiscall
vkt::pipeline::TestTexture::write(TestTexture *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  ssize_t extraout_RAX;
  int layerNdx;
  ulong uVar7;
  int levelNdx;
  uint uVar8;
  undefined4 in_register_00000034;
  int layerNdx_1;
  int levelNdx_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  ConstPixelBufferAccess srcAccess;
  PixelBufferAccess destAccess;
  uint local_b4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  TestTexture *local_88;
  TextureFormat local_80;
  IVec3 local_78;
  IVec3 local_6c;
  PixelBufferAccess local_58;
  undefined4 extraout_var_00;
  
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.order = LA;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,&local_80.order);
  iVar3 = (*this->_vptr_TestTexture[5])(this);
  if ((char)iVar3 == '\0') {
    (*this->_vptr_TestTexture[8])(&local_80,this,0,0);
    local_58.super_ConstPixelBufferAccess.m_format.order =
         tcu::TextureFormat::getPixelSize(&local_80);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(uint *)&local_58);
    dVar4 = 0;
    local_b4 = 0;
    local_88 = this;
    while( true ) {
      iVar3 = (*this->_vptr_TestTexture[2])(this);
      if (iVar3 <= (int)local_b4) break;
      uVar7 = 0;
      while( true ) {
        iVar3 = (*this->_vptr_TestTexture[4])(this);
        if (iVar3 <= (int)uVar7) break;
        dVar4 = getNextMultiple((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                                dVar4);
        (*this->_vptr_TestTexture[8])(&local_80,this,(ulong)local_b4,uVar7);
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_58,&local_80,&local_78,&local_6c,
                   (void *)((ulong)dVar4 + CONCAT44(in_register_00000034,__fd)));
        tcu::copy((EVP_PKEY_CTX *)&local_58,(EVP_PKEY_CTX *)&local_80);
        iVar2 = local_78.m_data[2];
        iVar1 = local_78.m_data[1];
        iVar3 = local_78.m_data[0];
        iVar5 = tcu::TextureFormat::getPixelSize(&local_80);
        dVar4 = iVar2 * iVar5 * iVar1 * iVar3 + dVar4;
        uVar7 = (ulong)((int)uVar7 + 1);
        this = local_88;
      }
      local_b4 = local_b4 + 1;
    }
  }
  else {
    iVar3 = (*this->_vptr_TestTexture[10])(this,0,0);
    local_80.order = tcu::getBlockSize(*(CompressedTexFormat *)CONCAT44(extraout_var,iVar3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,&local_80.order);
    uVar8 = 0;
    dVar4 = 0;
    while( true ) {
      iVar3 = (*this->_vptr_TestTexture[2])(this);
      if (iVar3 <= (int)uVar8) break;
      uVar7 = 0;
      while( true ) {
        iVar3 = (*this->_vptr_TestTexture[4])(this);
        if (iVar3 <= (int)uVar7) break;
        dVar4 = getNextMultiple((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
                                dVar4);
        iVar3 = (*this->_vptr_TestTexture[10])(this,(ulong)uVar8,uVar7);
        lVar6 = CONCAT44(extraout_var_00,iVar3);
        memcpy((void *)((ulong)dVar4 + CONCAT44(in_register_00000034,__fd)),*(void **)(lVar6 + 0x10)
               ,(long)(*(int *)(lVar6 + 0x18) - (int)*(void **)(lVar6 + 0x10)));
        dVar4 = (*(int *)(lVar6 + 0x18) - *(int *)(lVar6 + 0x10)) + dVar4;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      uVar8 = uVar8 + 1;
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
  return extraout_RAX;
}

Assistant:

void TestTexture::write (deUint8* destPtr) const
{
	std::vector<deUint32>	offsetMultiples;
	deUint32				levelOffset		= 0;

	offsetMultiples.push_back(4);

	if (isCompressed())
	{
		offsetMultiples.push_back(tcu::getBlockSize(getCompressedLevel(0, 0).getFormat()));

		for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
		{
			for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
			{
				levelOffset = getNextMultiple(offsetMultiples, levelOffset);

				const tcu::CompressedTexture&		compressedTex	= getCompressedLevel(levelNdx, layerNdx);

				deMemcpy(destPtr + levelOffset, compressedTex.getData(), compressedTex.getDataSize());
				levelOffset += compressedTex.getDataSize();
			}
		}
	}
	else
	{
		offsetMultiples.push_back(getLevel(0, 0).getFormat().getPixelSize());

		for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
		{
			for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
			{
				levelOffset = getNextMultiple(offsetMultiples, levelOffset);

				const tcu::ConstPixelBufferAccess	srcAccess		= getLevel(levelNdx, layerNdx);
				const tcu::PixelBufferAccess		destAccess		(srcAccess.getFormat(), srcAccess.getSize(), srcAccess.getPitch(), destPtr + levelOffset);

				tcu::copy(destAccess, srcAccess);
				levelOffset += srcAccess.getWidth() * srcAccess.getHeight() * srcAccess.getDepth() * srcAccess.getFormat().getPixelSize();
			}
		}
	}
}